

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::Transpose(ON_NurbsSurface *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  iVar2 = this->m_order[0];
  iVar3 = this->m_cv_count[0];
  iVar4 = this->m_cv_count[1];
  auVar1 = *(undefined1 (*) [16])this->m_knot;
  this->m_order[0] = this->m_order[1];
  this->m_order[1] = iVar2;
  this->m_cv_count[0] = iVar4;
  this->m_cv_count[1] = iVar3;
  *(ulong *)this->m_cv_stride =
       CONCAT44((int)*(undefined8 *)this->m_cv_stride,
                (int)((ulong)*(undefined8 *)this->m_cv_stride >> 0x20));
  *(ulong *)this->m_knot_capacity =
       CONCAT44((int)*(undefined8 *)this->m_knot_capacity,
                (int)((ulong)*(undefined8 *)this->m_knot_capacity >> 0x20));
  auVar5._0_8_ = auVar1._8_8_;
  auVar5._8_4_ = auVar1._0_4_;
  auVar5._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])this->m_knot = auVar5;
  return true;
}

Assistant:

bool
ON_NurbsSurface::Transpose()
{
  DestroySurfaceTree();
  int i;
  // transpose CV grid
  i = m_order[0]; m_order[0] = m_order[1]; m_order[1] = i;
  i = m_cv_count[0]; m_cv_count[0] = m_cv_count[1]; m_cv_count[1] = i;
  i = m_cv_stride[0]; m_cv_stride[0] = m_cv_stride[1]; m_cv_stride[1] = i;

  // swap knot vectors
  i = m_knot_capacity[0]; m_knot_capacity[0] = m_knot_capacity[1]; m_knot_capacity[1] = i;
  double* k = m_knot[0]; m_knot[0] = m_knot[1]; m_knot[1] = k;
  return true;
}